

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O0

Regexp * __thiscall
duckdb_re2::Regexp::Walker<duckdb_re2::Regexp_*>::WalkInternal
          (Walker<duckdb_re2::Regexp_*> *this,Regexp *re,Regexp *top_arg,bool use_copy)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  Regexp *pRVar5;
  ulong uVar6;
  Regexp **ppRVar7;
  Regexp *pRVar8;
  byte in_CL;
  Regexp *in_RDX;
  Regexp *in_RSI;
  long *in_RDI;
  Regexp **sub;
  bool stop;
  Regexp *t;
  WalkState<duckdb_re2::Regexp_*> *s;
  value_type *in_stack_fffffffffffffd98;
  LogMessage *in_stack_fffffffffffffda0;
  LogMessage *in_stack_fffffffffffffdb0;
  WalkState<duckdb_re2::Regexp_*> local_238;
  Regexp **local_208;
  byte local_1f9;
  Regexp *local_1f8;
  reference local_1f0;
  WalkState<duckdb_re2::Regexp_*> local_1e8 [6];
  Walker<duckdb_re2::Regexp_*> *in_stack_ffffffffffffff40;
  
  Reset(in_stack_ffffffffffffff40);
  if (in_RSI == (Regexp *)0x0) {
    LogMessage::LogMessage(in_stack_fffffffffffffda0,(char *)in_stack_fffffffffffffd98,0);
    poVar4 = LogMessage::stream((LogMessage *)((long)(local_1e8 + 1) + 0x10));
    std::operator<<(poVar4,"Walk NULL");
    LogMessage::~LogMessage(in_stack_fffffffffffffdb0);
    return in_RDX;
  }
  WalkState<duckdb_re2::Regexp_*>::WalkState(local_1e8,in_RSI,in_RDX);
  std::
  stack<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::deque<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>_>
  ::push((stack<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::deque<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>_>
          *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  do {
    while( true ) {
      local_1f0 = std::
                  stack<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::deque<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>_>
                  ::top((stack<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::deque<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>_>
                         *)0x8528e7);
      pRVar8 = local_1f0->re;
      if (local_1f0->n != -1) break;
      iVar3 = *(int *)((long)in_RDI + 0x5c) + -1;
      *(int *)((long)in_RDI + 0x5c) = iVar3;
      if (iVar3 < 0) {
        *(undefined1 *)(in_RDI + 0xb) = 1;
        local_1f8 = (Regexp *)(**(code **)(*in_RDI + 0x28))(in_RDI,pRVar8,local_1f0->parent_arg);
      }
      else {
        local_1f9 = 0;
        pRVar5 = (Regexp *)
                 (**(code **)(*in_RDI + 0x10))(in_RDI,pRVar8,local_1f0->parent_arg,&local_1f9);
        local_1f0->pre_arg = pRVar5;
        if ((local_1f9 & 1) == 0) {
          local_1f0->n = 0;
          local_1f0->child_args = (Regexp **)0x0;
          if (pRVar8->nsub_ == 1) {
            local_1f0->child_args = &local_1f0->child_arg;
          }
          else if (1 < pRVar8->nsub_) {
            auVar1 = ZEXT216(pRVar8->nsub_) * ZEXT816(8);
            uVar6 = auVar1._0_8_;
            if (auVar1._8_8_ != 0) {
              uVar6 = 0xffffffffffffffff;
            }
            ppRVar7 = (Regexp **)operator_new__(uVar6);
            local_1f0->child_args = ppRVar7;
          }
          break;
        }
        local_1f8 = local_1f0->pre_arg;
      }
LAB_00852bb2:
      std::
      stack<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::deque<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>_>
      ::pop((stack<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::deque<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>_>
             *)0x852bc0);
      bVar2 = std::
              stack<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::deque<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>_>
              ::empty((stack<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::deque<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>_>
                       *)0x852bce);
      if (bVar2) {
        return local_1f8;
      }
      local_1f0 = std::
                  stack<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::deque<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>_>
                  ::top((stack<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::deque<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>_>
                         *)0x852bf1);
      if (local_1f0->child_args == (Regexp **)0x0) {
        local_1f0->child_arg = local_1f8;
      }
      else {
        local_1f0->child_args[local_1f0->n] = local_1f8;
      }
      local_1f0->n = local_1f0->n + 1;
    }
    if ((pRVar8->nsub_ == 0) ||
       (local_208 = Regexp::sub(pRVar8), (int)(uint)pRVar8->nsub_ <= local_1f0->n)) {
      local_1f8 = (Regexp *)
                  (**(code **)(*in_RDI + 0x18))
                            (in_RDI,pRVar8,local_1f0->parent_arg,local_1f0->pre_arg,
                             local_1f0->child_args,local_1f0->n);
      if ((1 < pRVar8->nsub_) &&
         (in_stack_fffffffffffffda0 = (LogMessage *)local_1f0->child_args,
         in_stack_fffffffffffffda0 != (LogMessage *)0x0)) {
        operator_delete__(in_stack_fffffffffffffda0);
      }
      goto LAB_00852bb2;
    }
    if (((in_CL & 1) == 0) ||
       ((local_1f0->n < 1 || (local_208[local_1f0->n + -1] != local_208[local_1f0->n])))) {
      WalkState<duckdb_re2::Regexp_*>::WalkState
                (&local_238,local_208[local_1f0->n],local_1f0->pre_arg);
      std::
      stack<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::deque<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>_>
      ::push((stack<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::deque<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>_>
              *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    }
    else {
      pRVar8 = (Regexp *)
               (**(code **)(*in_RDI + 0x20))(in_RDI,local_1f0->child_args[local_1f0->n + -1]);
      local_1f0->child_args[local_1f0->n] = pRVar8;
      local_1f0->n = local_1f0->n + 1;
    }
  } while( true );
}

Assistant:

T Regexp::Walker<T>::WalkInternal(Regexp* re, T top_arg,
                                                       bool use_copy) {
  Reset();

  if (re == NULL) {
    LOG(DFATAL) << "Walk NULL";
    return top_arg;
  }

  stack_.push(WalkState<T>(re, top_arg));

  WalkState<T>* s;
  for (;;) {
    T t;
    s = &stack_.top();
    re = s->re;
    switch (s->n) {
      case -1: {
        if (--max_visits_ < 0) {
          stopped_early_ = true;
          t = ShortVisit(re, s->parent_arg);
          break;
        }
        bool stop = false;
        s->pre_arg = PreVisit(re, s->parent_arg, &stop);
        if (stop) {
          t = s->pre_arg;
          break;
        }
        s->n = 0;
        s->child_args = NULL;
        if (re->nsub_ == 1)
          s->child_args = &s->child_arg;
        else if (re->nsub_ > 1)
          s->child_args = new T[re->nsub_];
        FALLTHROUGH_INTENDED;
      }
      default: {
        if (re->nsub_ > 0) {
          Regexp** sub = re->sub();
          if (s->n < re->nsub_) {
            if (use_copy && s->n > 0 && sub[s->n - 1] == sub[s->n]) {
              s->child_args[s->n] = Copy(s->child_args[s->n - 1]);
              s->n++;
            } else {
              stack_.push(WalkState<T>(sub[s->n], s->pre_arg));
            }
            continue;
          }
        }

        t = PostVisit(re, s->parent_arg, s->pre_arg, s->child_args, s->n);
        if (re->nsub_ > 1)
          delete[] s->child_args;
        break;
      }
    }

    // We've finished stack_.top().
    // Update next guy down.
    stack_.pop();
    if (stack_.empty())
      return t;
    s = &stack_.top();
    if (s->child_args != NULL)
      s->child_args[s->n] = t;
    else
      s->child_arg = t;
    s->n++;
  }
}